

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smc.cpp
# Opt level: O0

void __thiscall SMC::init_REDCELL(SMC *this,Params *params)

{
  Residue *pRVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dis;
  value_type local_50;
  int j_1;
  int i;
  double local_40;
  int local_34;
  undefined1 local_30 [4];
  int j;
  vector<double,_std::allocator<double>_> EllipConst2A;
  Params *params_local;
  SMC *this_local;
  
  EllipConst2A.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)params;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_30);
  for (local_34 = 0; uVar3 = (ulong)local_34,
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)
                         (EllipConst2A.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 0x51)), uVar3 < sVar4;
      local_34 = local_34 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        (EllipConst2A.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x51),(long)local_34);
    iVar2 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        (EllipConst2A.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x54),(long)local_34);
    local_40 = Ellipsoid_Detect(&this->Conf,iVar2,*pvVar5,true);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)local_30,&local_40);
  }
  std::vector<int,_std::allocator<int>_>::clear(&this->Reslist);
  local_50 = 1;
  do {
    if ((this->Conf)._numRes < local_50) {
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_30);
      return;
    }
    iVar2 = Atom::is_at_origin(&(this->Conf)._res[local_50]._center);
    if (iVar2 == 0) {
      for (dis._4_4_ = 0;
          sVar4 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)
                             (EllipConst2A.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 0x51)),
          (ulong)(long)dis._4_4_ < sVar4; dis._4_4_ = dis._4_4_ + 1) {
        pRVar1 = (this->Conf)._res;
        lVar7 = (long)local_50;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            (EllipConst2A.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 0x51),
                            (long)dis._4_4_);
        dVar8 = Point::dis(&pRVar1[lVar7]._center.super_Point,&pRVar1[*pvVar5]._atom[1].super_Point)
        ;
        pRVar1 = (this->Conf)._res;
        lVar7 = (long)local_50;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            (EllipConst2A.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 0x54),
                            (long)dis._4_4_);
        dVar9 = Point::dis(&pRVar1[lVar7]._center.super_Point,&pRVar1[*pvVar5]._atom[2].super_Point)
        ;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_30,(long)dis._4_4_);
        if (dVar8 + dVar9 < *pvVar6 + Residue::size[(this->Conf)._res[local_50]._type] + 5.5) {
          std::vector<int,_std::allocator<int>_>::push_back(&this->Reslist,&local_50);
          break;
        }
      }
    }
    else {
      std::vector<int,_std::allocator<int>_>::push_back(&this->Reslist,&local_50);
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

void SMC::init_REDCELL(const struct Params &params) {
    // calculate Ellipsoid constant 2a
    vector<double> EllipConst2A;
    for (int j = 0; j < params.starts.size(); j++)
        EllipConst2A.push_back(Ellipsoid_Detect(this->Conf, params.starts[j], params.ends[j], true));

    this->Reslist.clear();
    // test the space after using ellipsoid and surface
    for (int i = 1; i <= this->Conf._numRes; i++) {
        // Assuming this residue is part of simulated loop region, always include it!
        if (this->Conf._res[i]._center.is_at_origin()) {
            this->Reslist.push_back(i);
            continue;
        }

        for (int j = 0; j < params.starts.size(); j++) {
            const double dis = this->Conf._res[i]._center.dis(this->Conf._res[params.starts[j]]._atom[ATM_CA]) +
                               this->Conf._res[i]._center.dis(this->Conf._res[params.ends[j]]._atom[ATM_C]);
            if (dis < EllipConst2A[j] + Residue::size[this->Conf._res[i]._type] + CUB_SIZE) {
                this->Reslist.push_back(i);
                break;
            }
        }
    }
}